

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

cgltf_float cgltf_json_to_float(jsmntok_t *tok,uint8_t *json_chunk)

{
  uint uVar1;
  size_t __n;
  double dVar2;
  char tmp [128];
  char acStack_98 [136];
  
  if (tok->type == JSMN_PRIMITIVE) {
    uVar1 = tok->end - tok->start;
    __n = 0x7f;
    if (uVar1 < 0x7f) {
      __n = (size_t)uVar1;
    }
    strncpy(acStack_98,(char *)(json_chunk + tok->start),__n);
    acStack_98[__n] = '\0';
    dVar2 = atof(acStack_98);
    return (float)dVar2;
  }
  return -1.0;
}

Assistant:

static cgltf_float cgltf_json_to_float(jsmntok_t const* tok, const uint8_t* json_chunk)
{
    CGLTF_CHECK_TOKTYPE(*tok, JSMN_PRIMITIVE);
    char tmp[128];
    int size = (cgltf_size)(tok->end - tok->start) < sizeof(tmp) ? tok->end - tok->start : (int)(sizeof(tmp) - 1);
    strncpy(tmp, (const char*)json_chunk + tok->start, size);
    tmp[size] = 0;
    return (cgltf_float)CGLTF_ATOF(tmp);
}